

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

char * tcu::astc::getBlockTestTypeDescription(BlockTestType testType)

{
  char *pcStack_10;
  BlockTestType testType_local;
  
  switch(testType) {
  case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
    pcStack_10 = "Test void extent block, LDR mode";
    break;
  case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
    pcStack_10 = "Test void extent block, HDR mode";
    break;
  case BLOCK_TEST_TYPE_WEIGHT_GRID:
    pcStack_10 = 
    "Test combinations of plane count, weight integer sequence encoding parameters, and weight grid size"
    ;
    break;
  case BLOCK_TEST_TYPE_WEIGHT_ISE:
    pcStack_10 = "Test different integer sequence encoding block values for weight grid";
    break;
  case BLOCK_TEST_TYPE_CEMS:
    pcStack_10 = 
    "Test different color endpoint mode combinations, combined with different plane and partition counts"
    ;
    break;
  case BLOCK_TEST_TYPE_PARTITION_SEED:
    pcStack_10 = "Test different partition pattern indices";
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
    pcStack_10 = 
    "Test various combinations of each pair of color endpoint values, for each LDR color endpoint mode"
    ;
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
    pcStack_10 = 
    "Test various combinations of each pair of color endpoint values, for each HDR color endpoint mode other than mode 15"
    ;
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
    pcStack_10 = 
    "Test various combinations of each pair of color endpoint values, HDR color endpoint mode 15";
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_ISE:
    pcStack_10 = "Test different integer sequence encoding block values for color endpoints";
    break;
  case BLOCK_TEST_TYPE_CCS:
    pcStack_10 = "Test color component selector, for different partition counts";
    break;
  case BLOCK_TEST_TYPE_RANDOM:
    pcStack_10 = "Random block test";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getBlockTestTypeDescription (BlockTestType testType)
{
	switch (testType)
	{
		case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:			return "Test void extent block, LDR mode";
		case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:			return "Test void extent block, HDR mode";
		case BLOCK_TEST_TYPE_WEIGHT_GRID:				return "Test combinations of plane count, weight integer sequence encoding parameters, and weight grid size";
		case BLOCK_TEST_TYPE_WEIGHT_ISE:				return "Test different integer sequence encoding block values for weight grid";
		case BLOCK_TEST_TYPE_CEMS:						return "Test different color endpoint mode combinations, combined with different plane and partition counts";
		case BLOCK_TEST_TYPE_PARTITION_SEED:			return "Test different partition pattern indices";
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:		return "Test various combinations of each pair of color endpoint values, for each LDR color endpoint mode";
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:	return "Test various combinations of each pair of color endpoint values, for each HDR color endpoint mode other than mode 15";
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:		return "Test various combinations of each pair of color endpoint values, HDR color endpoint mode 15";
		case BLOCK_TEST_TYPE_ENDPOINT_ISE:				return "Test different integer sequence encoding block values for color endpoints";
		case BLOCK_TEST_TYPE_CCS:						return "Test color component selector, for different partition counts";
		case BLOCK_TEST_TYPE_RANDOM:					return "Random block test";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}